

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementBeamEuler::ComputeStiffnessMatrix(ChElementBeamEuler *this)

{
  ChMatrixDynamic<> *this_00;
  double dVar1;
  Scalar SVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  element_type *peVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Scalar *pSVar26;
  int c;
  long col;
  int i;
  long lVar27;
  long row;
  undefined1 auVar28 [16];
  double in_XMM0_Qa;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 in_XMM0_Qb;
  undefined8 uVar44;
  undefined1 auVar43 [64];
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  double dVar62;
  double dVar63;
  undefined1 local_1f8 [16];
  int local_144;
  ChMatrixDynamic<> CKtemp;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_118;
  double local_d8;
  undefined8 uStack_d0;
  ChMatrixRef local_c8;
  ChMatrixRef local_a0;
  ChMatrix33<double> Rotsect;
  
  peVar15 = (this->section).
            super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar15 != (element_type *)0x0) {
    (*(peVar15->super_ChBeamSection)._vptr_ChBeamSection[2])();
    dVar29 = in_XMM0_Qa;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[4])();
    dVar30 = dVar29;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[5])();
    dVar45 = dVar30;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[3])();
    dVar31 = dVar45;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[7])();
    dVar32 = dVar31;
    uVar44 = in_XMM0_Qb;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[8])();
    dVar33 = dVar32;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[9])();
    dVar34 = dVar33;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[10])();
    dVar1 = (this->super_ChElementBeam).length;
    this_00 = &this->Km;
    row = 0;
    in_XMM0_Qa = in_XMM0_Qa / dVar1;
    dVar48 = dVar1 * dVar1;
    dVar45 = dVar45 / dVar1;
    dVar46 = (dVar30 * 12.0) / (dVar1 * dVar48);
    dVar61 = (dVar29 * 12.0) / (dVar1 * dVar48);
    dVar47 = (dVar30 * 4.0) / dVar1;
    dVar62 = (dVar29 * 4.0) / dVar1;
    dVar63 = (dVar29 * 6.0) / dVar48;
    dVar48 = (dVar30 * 6.0) / dVar48;
    local_d8 = dVar34;
    uStack_d0 = uVar44;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,0,0
                        );
    *pSVar26 = in_XMM0_Qa;
    lVar27 = 1;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,1,1
                        );
    *pSVar26 = dVar46;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,2,2
                        );
    *pSVar26 = dVar61;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,3,3
                        );
    *pSVar26 = dVar45;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,4,4
                        );
    *pSVar26 = dVar62;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,5,5
                        );
    *pSVar26 = dVar47;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,6,6
                        );
    *pSVar26 = in_XMM0_Qa;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,7,7
                        );
    *pSVar26 = dVar46;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,8,8
                        );
    *pSVar26 = dVar61;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,9,9
                        );
    *pSVar26 = dVar45;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,10,
                         10);
    *pSVar26 = dVar62;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,0xb
                         ,0xb);
    *pSVar26 = dVar47;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,0,6
                        );
    auVar23._8_4_ = 0;
    auVar23._0_8_ = -in_XMM0_Qa;
    auVar23._12_4_ = 0x80000000;
    SVar2 = (Scalar)vmovlps_avx(auVar23);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,1,7
                        );
    auVar21._8_4_ = 0;
    auVar21._0_8_ = -dVar46;
    auVar21._12_4_ = 0x80000000;
    SVar2 = (Scalar)vmovlps_avx(auVar21);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,2,8
                        );
    auVar22._8_4_ = 0;
    auVar22._0_8_ = -dVar61;
    auVar22._12_4_ = 0x80000000;
    SVar2 = (Scalar)vmovlps_avx(auVar22);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,3,9
                        );
    auVar28._8_4_ = 0;
    auVar28._0_8_ = -dVar45;
    auVar28._12_4_ = 0x80000000;
    SVar2 = (Scalar)vmovlps_avx(auVar28);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,4,
                         10);
    *pSVar26 = (dVar29 + dVar29) / dVar1;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,5,
                         0xb);
    *pSVar26 = (dVar30 + dVar30) / dVar1;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,4,8
                        );
    *pSVar26 = dVar63;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,5,7
                        );
    auVar16._8_4_ = 0;
    auVar16._0_8_ = -dVar48;
    auVar16._12_4_ = 0x80000000;
    SVar2 = (Scalar)vmovlps_avx(auVar16);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,1,
                         0xb);
    *pSVar26 = dVar48;
    local_1f8._0_8_ = -dVar63;
    local_1f8._8_4_ = 0;
    local_1f8._12_4_ = 0x80000000;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,2,
                         10);
    SVar2 = (Scalar)vmovlps_avx(local_1f8);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,1,5
                        );
    *pSVar26 = dVar48;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,2,4
                        );
    SVar2 = (Scalar)vmovlps_avx(local_1f8);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,7,
                         0xb);
    auVar20._8_4_ = 0;
    auVar20._0_8_ = -dVar48;
    auVar20._12_4_ = 0x80000000;
    SVar2 = (Scalar)vmovlps_avx(auVar20);
    *pSVar26 = SVar2;
    pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,8,
                         10);
    auVar43 = ZEXT864((ulong)dVar63);
    *pSVar26 = dVar63;
    for (; auVar28 = auVar43._0_16_, col = lVar27, row != 0xc; row = row + 1) {
      for (; col != 0xc; col = col + 1) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,row,col);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,col,row);
        auVar43 = ZEXT864((ulong)SVar2);
        *pSVar26 = SVar2;
      }
      lVar27 = lVar27 + 1;
    }
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[6])();
    if ((auVar28._0_8_ != 0.0) || (NAN(auVar28._0_8_))) {
      (*(((this->section).
          super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChBeamSection)._vptr_ChBeamSection[6])();
      auVar17._8_8_ = 0x8000000000000000;
      auVar17._0_8_ = 0x8000000000000000;
      auVar28 = vxorpd_avx512vl(auVar28,auVar17);
      local_118.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)vmovlpd_avx(auVar28);
      local_118.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0;
      local_118.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0;
      ChMatrix33<double>::Set_A_Rxyz(&Rotsect,(ChVector<double> *)&local_118);
      local_144 = 0xc;
      local_118.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)
                CONCAT44(local_118.
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         .
                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_data._4_4_,0xc);
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&CKtemp,(int *)&local_118,&local_144);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&CKtemp);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_118,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this_00,
                 (type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_a0,
                 &CKtemp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
                 (type *)0x0);
      ChMatrixCorotation::ComputeCK(&local_118,&Rotsect,4,&local_a0);
      Eigen::internal::handmade_aligned_free
                (local_118.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                 .m_storage.m_data);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_118,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&CKtemp,
                 (type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_c8,
                 &this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
                 (type *)0x0);
      ChMatrixCorotation::ComputeKCt(&local_118,&Rotsect,4,&local_c8);
      Eigen::internal::handmade_aligned_free
                (local_118.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                 .m_storage.m_data);
      Eigen::internal::handmade_aligned_free
                (CKtemp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                 m_data);
    }
    if ((((dVar31 != 0.0) || (NAN(dVar31))) || (dVar32 != 0.0)) || (NAN(dVar32))) {
      lVar27 = 0;
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,0,lVar27);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,4,lVar27);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar32;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *pSVar26;
        auVar28 = vfmadd213sd_fma(auVar49,auVar35,auVar3);
        *pSVar26 = auVar28._0_8_;
      }
      auVar24._8_8_ = in_XMM0_Qb;
      auVar24._0_8_ = dVar31;
      lVar27 = 0;
      auVar19._8_8_ = 0x8000000000000000;
      auVar19._0_8_ = 0x8000000000000000;
      auVar28 = vxorpd_avx512vl(auVar24,auVar19);
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,0,lVar27);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,5,lVar27);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *pSVar26;
        auVar16 = vfmadd213sd_fma(auVar51,auVar28,auVar5);
        *pSVar26 = auVar16._0_8_;
      }
      lVar27 = 0;
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,6,lVar27);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,10,lVar27);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar32;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *pSVar26;
        auVar16 = vfmadd213sd_fma(auVar53,auVar38,auVar7);
        *pSVar26 = auVar16._0_8_;
      }
      lVar27 = 0;
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,6,lVar27);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,0xb,lVar27);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *pSVar26;
        auVar16 = vfmadd213sd_fma(auVar55,auVar28,auVar9);
        *pSVar26 = auVar16._0_8_;
      }
      lVar27 = 0;
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,0);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,4);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar32;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *pSVar26;
        auVar16 = vfmadd213sd_fma(auVar57,auVar41,auVar11);
        *pSVar26 = auVar16._0_8_;
      }
      lVar27 = 0;
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,0);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,5);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *pSVar26;
        auVar16 = vfmadd213sd_fma(auVar58,auVar28,auVar12);
        *pSVar26 = auVar16._0_8_;
      }
      lVar27 = 0;
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,6);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,10);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar32;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *pSVar26;
        auVar16 = vfmadd213sd_fma(auVar59,auVar42,auVar13);
        *pSVar26 = auVar16._0_8_;
      }
      lVar27 = 0;
      while (lVar27 != 0xc) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,6);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,0xb);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = SVar2;
        lVar27 = lVar27 + 1;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *pSVar26;
        auVar16 = vfmadd213sd_fma(auVar60,auVar28,auVar14);
        *pSVar26 = auVar16._0_8_;
      }
    }
    auVar25._8_8_ = uStack_d0;
    auVar25._0_8_ = local_d8;
    if (((dVar33 != 0.0) || (NAN(dVar33))) || ((local_d8 != 0.0 || (NAN(local_d8))))) {
      auVar18._8_8_ = 0x8000000000000000;
      auVar18._0_8_ = 0x8000000000000000;
      auVar28 = vxorpd_avx512vl(auVar25,auVar18);
      for (lVar27 = 0; local_1f8._0_8_ = auVar28._0_8_, lVar27 != 0xc; lVar27 = lVar27 + 1) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,1,lVar27);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,2,lVar27);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = SVar2;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_1f8._0_8_;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = dVar33 * *pSVar26;
        auVar16 = vfmadd231sd_fma(auVar50,auVar36,auVar4);
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,3,lVar27);
        *pSVar26 = auVar16._0_8_ + *pSVar26;
      }
      for (lVar27 = 0; lVar27 != 0xc; lVar27 = lVar27 + 1) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,7,lVar27);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,8,lVar27);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = SVar2;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_1f8._0_8_;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = dVar33 * *pSVar26;
        auVar28 = vfmadd231sd_fma(auVar52,auVar37,auVar6);
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,9,lVar27);
        *pSVar26 = auVar28._0_8_ + *pSVar26;
      }
      for (lVar27 = 0; lVar27 != 0xc; lVar27 = lVar27 + 1) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,1);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,2);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = SVar2;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_1f8._0_8_;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = dVar33 * *pSVar26;
        auVar28 = vfmadd231sd_fma(auVar54,auVar39,auVar8);
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,3);
        *pSVar26 = auVar28._0_8_ + *pSVar26;
      }
      for (lVar27 = 0; lVar27 != 0xc; lVar27 = lVar27 + 1) {
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,7);
        SVar2 = *pSVar26;
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,8);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = SVar2;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_1f8._0_8_;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = dVar33 * *pSVar26;
        auVar28 = vfmadd231sd_fma(auVar56,auVar40,auVar10);
        pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar27,9);
        *pSVar26 = auVar28._0_8_ + *pSVar26;
      }
    }
    return;
  }
  __assert_fail("section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                ,0xae,"void chrono::fea::ChElementBeamEuler::ComputeStiffnessMatrix()");
}

Assistant:

void ChElementBeamEuler::ComputeStiffnessMatrix() {
    assert(section);

    double EA = this->section->GetAxialRigidity();
    double EIyy = this->section->GetYbendingRigidity();
    double EIzz = this->section->GetZbendingRigidity();
    double GJ = this->section->GetXtorsionRigidity();
    double Cy = this->section->GetCentroidY();
    double Cz = this->section->GetCentroidZ();
    double Sy = this->section->GetShearCenterY();
    double Sz = this->section->GetShearCenterZ();

    double h = this->length;

    double om_xz = 0;  // For Euler-Bernoulli
    double om_xy = 0;  // For Euler-Bernoulli
    /*
    if (false) {
        //// TEST REDDY BEAMS
        double Ks_z = section->Ks_z;
        double Ks_y = section->Ks_y;
        double om_xz = E * Iyy / (G * Area * Ks_z * h);  // For Reddy's RBT
        double om_xy = E * Izz / (G * Area * Ks_y * h);  // For Reddy's RBT
    }
    */
    double u_xz = 1 + 12 * om_xz;
    double l_xz = 1 + 3 * om_xz;
    double e_xz = 1 - 6 * om_xz;
    double u_xy = 1 + 12 * om_xy;
    double l_xy = 1 + 3 * om_xy;
    double e_xy = 1 - 6 * om_xy;

    double k_u = EA / h;
    double k_f = GJ / h;

    double k_w = 12 * EIyy / (u_xz * h * h * h);
    double k_v = 12 * EIzz / (u_xy * h * h * h);

    double k_t = 4 * EIyy * l_xz / (u_xz * h);
    double k_p = 4 * EIzz * l_xy / (u_xy * h);

    double k_wt = 6 * EIyy / (u_xz * h * h);
    double k_vp = 6 * EIzz / (u_xy * h * h);

    double k_tt = 2 * EIyy * e_xz / (u_xz * h);
    double k_pp = 2 * EIzz * e_xy / (u_xy * h);

    Km(0, 0) = k_u;
    Km(1, 1) = k_v;
    Km(2, 2) = k_w;
    Km(3, 3) = k_f;
    Km(4, 4) = k_t;
    Km(5, 5) = k_p;
    Km(6, 6) = k_u;
    Km(7, 7) = k_v;
    Km(8, 8) = k_w;
    Km(9, 9) = k_f;
    Km(10, 10) = k_t;
    Km(11, 11) = k_p;

    Km(0, 6) = -k_u;
    Km(1, 7) = -k_v;
    Km(2, 8) = -k_w;
    Km(3, 9) = -k_f;
    Km(4, 10) = k_tt;
    Km(5, 11) = k_pp;

    Km(4, 8) = k_wt;
    Km(5, 7) = -k_vp;
    Km(1, 11) = k_vp;
    Km(2, 10) = -k_wt;

    Km(1, 5) = k_vp;
    Km(2, 4) = -k_wt;
    Km(7, 11) = -k_vp;
    Km(8, 10) = k_wt;

    // symmetric part;
    for (int r = 0; r < 12; r++)
        for (int c = r + 1; c < 12; c++)
            Km(c, r) = Km(r, c);

    // In case the section is rotated:
    if (this->section->GetSectionRotation()) {
        // Do [K]^ = [R][K][R]'
        ChMatrix33<> Rotsect;
        Rotsect.Set_A_Rxyz(ChVector<>(-section->GetSectionRotation(), 0, 0));
        ChMatrixDynamic<> CKtemp(12, 12);
        CKtemp.setZero();
        ChMatrixCorotation::ComputeCK(this->Km, Rotsect, 4, CKtemp);
        ChMatrixCorotation::ComputeKCt(CKtemp, Rotsect, 4, this->Km);
    }
    // In case the section has a centroid displacement:

    if (Cy || Cz) {
        // Do [K]" = [T_c][K]^[T_c]'

        for (int i = 0; i < 12; ++i)
            this->Km(4, i) += Cz * this->Km(0, i);
        for (int i = 0; i < 12; ++i)
            this->Km(5, i) += -Cy * this->Km(0, i);

        for (int i = 0; i < 12; ++i)
            this->Km(10, i) += Cz * this->Km(6, i);
        for (int i = 0; i < 12; ++i)
            this->Km(11, i) += -Cy * this->Km(6, i);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 4) += Cz * this->Km(i, 0);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 5) += -Cy * this->Km(i, 0);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 10) += Cz * this->Km(i, 6);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 11) += -Cy * this->Km(i, 6);
    }

    // In case the section has a shear center displacement:
    if (Sy || Sz) {
        // Do [K]?= [T_s][K]"[T_s]'

        for (int i = 0; i < 12; ++i)
            this->Km(3, i) +=
                - Sz * this->Km(1, i) + Sy * this->Km(2, i);
        for (int i = 0; i < 12; ++i)
            this->Km(9, i) +=
                - Sz * this->Km(7, i) + Sy * this->Km(8, i);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 3) +=
                - Sz * this->Km(i, 1) + Sy * this->Km(i, 2);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 9) +=
                - Sz * this->Km(i, 7) + Sy * this->Km(i, 8);
    }
}